

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

int __thiscall Algorithms::legendreSymbol(Algorithms *this,BigInteger *a,BigInteger *p)

{
  bool bVar1;
  BigInteger local_f8;
  BigInteger local_d8;
  BigInteger local_b8;
  BigInteger local_98;
  BigInteger local_68;
  BigInteger local_48;
  BigInteger *local_28;
  BigInteger *p_local;
  BigInteger *a_local;
  Algorithms *this_local;
  
  local_28 = p;
  p_local = a;
  a_local = (BigInteger *)this;
  BigIntegerLibrary::BigInteger::operator%(&local_48,a,p);
  BigIntegerLibrary::BigInteger::BigInteger(&local_68,0);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_48,&local_68);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_68);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_48);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    BigIntegerLibrary::BigInteger::operator-(&local_d8,p,1);
    BigIntegerLibrary::BigInteger::operator/(&local_b8,&local_d8,2);
    BigIntegerLibrary::powm(&local_98,a,&local_b8,p);
    BigIntegerLibrary::BigInteger::BigInteger(&local_f8,1);
    bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_98,&local_f8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_f8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_98);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_b8);
    BigIntegerLibrary::BigInteger::~BigInteger(&local_d8);
    if (bVar1) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = -1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Algorithms::legendreSymbol(BigInteger a, BigInteger p) {
    if (a % p == 0) {
        return 0;
    }
    if (powm(a, (p - 1) / 2, p) == 1) {
        return 1;
    }
    return -1;
}